

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O2

void pztopology::TPZPrism::ComputeHDivDirections<Fad<double>>
               (TPZFMatrix<Fad<double>_> *gradx,TPZFMatrix<Fad<double>_> *directions)

{
  Fad<double> *pFVar1;
  TPZVec<Fad<double>_> *vetor;
  TPZVec<Fad<double>_> *vetor_00;
  TPZVec<Fad<double>_> *vetor_01;
  TPZVec<Fad<double>_> *vetor_02;
  int i;
  long lVar2;
  int i_1;
  long lVar3;
  int iv;
  long col;
  bool bVar4;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_710;
  undefined1 local_700 [8];
  undefined8 local_6f8;
  double *pdStack_6f0;
  double dStack_6e8;
  undefined1 local_6e0 [16];
  Fad<double> Nv3v1;
  Fad<double> Nv2v3;
  TPZManVector<Fad<double>,_3> NormalScales;
  Fad<double> Nv3vdiag;
  TPZManVector<Fad<double>,_3> v2;
  TPZManVector<Fad<double>,_3> v1;
  Fad<double> Nv1v2;
  TPZManVector<Fad<double>,_3> v3;
  Fad<double> detjac;
  TPZManVector<Fad<double>,_3> v3vdiag;
  TPZManVector<Fad<double>,_3> vdiag;
  TPZManVector<Fad<double>,_3> v2v3;
  TPZManVector<Fad<double>,_3> v3v1;
  TPZManVector<Fad<double>,_3> v1v2;
  TPZManVector<Fad<double>,_3> vec3;
  TPZManVector<Fad<double>,_3> vec2;
  TPZManVector<Fad<double>,_3> vec1;
  
  TPZAxesTools<Fad<double>_>::ComputeDetjac(&detjac,gradx);
  TPZManVector<Fad<double>,_3>::TPZManVector(&v1,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&v2,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&v3,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&v1v2,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&v3v1,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&v2v3,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&vec1,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&vec2,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&vec3,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&vdiag,3);
  TPZManVector<Fad<double>,_3>::TPZManVector(&v3vdiag,3);
  lVar3 = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(gradx,lVar2,0);
    Fad<double>::operator=
              ((Fad<double> *)((long)&(v1.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar3),pFVar1);
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(gradx,lVar2,1);
    Fad<double>::operator=
              ((Fad<double> *)((long)&(v2.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar3),pFVar1);
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(gradx,lVar2,2);
    Fad<double>::operator=
              ((Fad<double> *)((long)&(v3.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar3),pFVar1);
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(gradx,lVar2,0);
    NormalScales.super_TPZVec<Fad<double>_>.fStore =
         TPZFMatrix<Fad<double>_>::operator()(gradx,lVar2,1);
    NormalScales.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)pFVar1;
    Fad<double>::operator=
              ((Fad<double> *)((long)&(vdiag.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar3),
               (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)&NormalScales);
    lVar3 = lVar3 + 0x20;
  }
  TPZNumeric::ProdVetorial<Fad<double>>
            (&v1.super_TPZVec<Fad<double>_>,&v2.super_TPZVec<Fad<double>_>,
             &v1v2.super_TPZVec<Fad<double>_>);
  TPZNumeric::ProdVetorial<Fad<double>>
            (&v2.super_TPZVec<Fad<double>_>,&v3.super_TPZVec<Fad<double>_>,
             &v2v3.super_TPZVec<Fad<double>_>);
  TPZNumeric::ProdVetorial<Fad<double>>
            (&v3.super_TPZVec<Fad<double>_>,&v1.super_TPZVec<Fad<double>_>,
             &v3v1.super_TPZVec<Fad<double>_>);
  TPZNumeric::ProdVetorial<Fad<double>>
            (&v3.super_TPZVec<Fad<double>_>,&vdiag.super_TPZVec<Fad<double>_>,
             &v3vdiag.super_TPZVec<Fad<double>_>);
  TPZNumeric::Norm<Fad<double>>(&Nv1v2,(TPZNumeric *)&v1v2,vetor);
  TPZNumeric::Norm<Fad<double>>(&Nv2v3,(TPZNumeric *)&v2v3,vetor_00);
  TPZNumeric::Norm<Fad<double>>(&Nv3v1,(TPZNumeric *)&v3v1,vetor_01);
  TPZNumeric::Norm<Fad<double>>(&Nv3vdiag,(TPZNumeric *)&v3vdiag,vetor_02);
  local_700 = (undefined1  [8])0x3ff0000000000000;
  local_6f8 = (Fad<double> *)((ulong)local_6f8._4_4_ << 0x20);
  pdStack_6f0 = (double *)0x0;
  dStack_6e8 = 0.0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&NormalScales,4,(Fad<double> *)local_700);
  Fad<double>::~Fad((Fad<double> *)local_700);
  local_700 = (undefined1  [8])0x3ff0000000000000;
  Fad<double>::operator=<double,_nullptr>(&Nv1v2,(double *)local_700);
  local_700 = (undefined1  [8])0x4000000000000000;
  Fad<double>::operator=<double,_nullptr>(&Nv2v3,(double *)local_700);
  local_700 = (undefined1  [8])0x4000000000000000;
  Fad<double>::operator=<double,_nullptr>(&Nv3v1,(double *)local_700);
  local_700 = (undefined1  [8])0x4000000000000000;
  Fad<double>::operator=<double,_nullptr>(&Nv3vdiag,(double *)local_700);
  for (lVar2 = 0; lVar2 != 0x60; lVar2 = lVar2 + 0x20) {
    Fad<double>::operator/=<double,_nullptr>
              ((Fad<double> *)((long)&(v1.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar2),&detjac)
    ;
    Fad<double>::operator/=<double,_nullptr>
              ((Fad<double> *)((long)&(v2.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar2),&detjac)
    ;
    Fad<double>::operator/=<double,_nullptr>
              ((Fad<double> *)((long)&(v3.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar2),&detjac)
    ;
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    lVar3 = 7;
    col = 0;
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      local_6e0._0_8_ = v3.super_TPZVec<Fad<double>_>.fStore + lVar2;
      local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
      local_710.fadexpr_.right_ = NormalScales.super_TPZVec<Fad<double>_>.fStore;
      local_700 = (undefined1  [8])&local_710;
      local_6f8 = (Fad<double> *)0x4018000000000000;
      pdStack_6f0 = (double *)0x0;
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,col);
      Fad<double>::operator=
                (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                         *)local_700);
      local_710.fadexpr_.left_ = v3.super_TPZVec<Fad<double>_>.fStore + lVar2;
      local_710.fadexpr_.right_ = NormalScales.super_TPZVec<Fad<double>_>.fStore;
      local_700 = (undefined1  [8])&local_710;
      local_6f8 = (Fad<double> *)0x4018000000000000;
      pdStack_6f0 = (double *)0x0;
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,col + 0x22);
      Fad<double>::operator=
                (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                         *)local_700);
      col = col + 1;
    }
    local_6e0._0_8_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv3v1;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 2;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,7);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_6e0._8_8_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv3v1;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 2;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,8);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_6e0._8_8_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv3v1;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 2;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,9);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv3v1;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 2;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,10);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,7);
    local_710.fadexpr_.right_ = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,8);
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    local_710.fadexpr_.left_ = pFVar1;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0xb);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_6e0._8_8_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv3v1;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 2;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0xc);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,9);
    local_710.fadexpr_.right_ = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,10);
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    local_710.fadexpr_.left_ = pFVar1;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0xd);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv3v1;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 2;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0xe);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0xc);
    local_710.fadexpr_.right_ = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0xe);
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    local_710.fadexpr_.left_ = pFVar1;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0xf);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv3vdiag;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 3;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x10);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv3vdiag;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 3;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x11);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv3vdiag;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 3;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x12);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv3vdiag;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 3;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x13);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x10);
    local_710.fadexpr_.right_ = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x11);
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    local_710.fadexpr_.left_ = pFVar1;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x14);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv3vdiag;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 3;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x15);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x12);
    local_710.fadexpr_.right_ = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x13);
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    local_710.fadexpr_.left_ = pFVar1;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x16);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv3vdiag;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 3;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x17);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x15);
    local_710.fadexpr_.right_ = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x17);
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    local_710.fadexpr_.left_ = pFVar1;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x18);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv2v3;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 1;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x19);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_6e0._8_8_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv2v3;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 1;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x1a);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_6e0._8_8_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv2v3;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 1;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x1b);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv2v3;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 1;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x1c);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x19);
    local_710.fadexpr_.right_ = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x1a);
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    local_710.fadexpr_.left_ = pFVar1;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x1d);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_6e0._8_8_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv2v3;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 1;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x1e);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x1b);
    local_710.fadexpr_.right_ = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x1c);
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    local_710.fadexpr_.left_ = pFVar1;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x1f);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv2v3;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 1;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x20);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x1e);
    local_710.fadexpr_.right_ = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x20);
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    local_710.fadexpr_.left_ = pFVar1;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x21);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv2v3;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 1;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x29);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x2a);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv3v1;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 2;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x2b);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v3.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore;
    local_710.fadexpr_.right_ = &Nv1v2;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x2c);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v3.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore;
    local_710.fadexpr_.right_ = &Nv1v2;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x2d);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v3.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore;
    local_710.fadexpr_.right_ = &Nv1v2;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x2e);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv2v3;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 1;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x2f);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x30);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_710.fadexpr_.right_ = &Nv3v1;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 2;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x31);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv2v3;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 1;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x32);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv3v1;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 2;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x33);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_6e0._8_8_ = &Nv2v3;
    local_710.fadexpr_.right_ = NormalScales.super_TPZVec<Fad<double>_>.fStore + 1;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x34);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v3.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore;
    local_710.fadexpr_.right_ = &Nv1v2;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x35);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x36);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v3.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore;
    local_710.fadexpr_.right_ = &Nv1v2;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x37);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_6e0._0_8_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_6e0._8_8_ = &Nv3v1;
    local_710.fadexpr_.right_ = NormalScales.super_TPZVec<Fad<double>_>.fStore + 2;
    local_710.fadexpr_.left_ = (Fad<double> *)local_6e0;
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = (Fad<double> *)0x4000000000000000;
    pdStack_6f0 = (double *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x38);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v3.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore;
    local_710.fadexpr_.right_ = &Nv1v2;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x39);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv2v3;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 1;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x3a);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv3v1;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 2;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x3b);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v1.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv2v3;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 1;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x3c);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v2.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_710.fadexpr_.right_ = &Nv3v1;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore + 2;
    local_700 = (undefined1  [8])&local_710;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x3d);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
    local_710.fadexpr_.left_ = v3.super_TPZVec<Fad<double>_>.fStore + lVar2;
    local_700 = (undefined1  [8])&local_710;
    local_6f8 = NormalScales.super_TPZVec<Fad<double>_>.fStore;
    local_710.fadexpr_.right_ = &Nv1v2;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar2,0x3e);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_700);
  }
  TPZManVector<Fad<double>,_3>::~TPZManVector(&NormalScales);
  Fad<double>::~Fad(&Nv3vdiag);
  Fad<double>::~Fad(&Nv3v1);
  Fad<double>::~Fad(&Nv2v3);
  Fad<double>::~Fad(&Nv1v2);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&v3vdiag);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&vdiag);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&vec3);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&vec2);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&vec1);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&v2v3);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&v3v1);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&v1v2);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&v3);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&v2);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&v1);
  Fad<double>::~Fad(&detjac);
  return;
}

Assistant:

void TPZPrism::ComputeHDivDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3),v1v2(3),v3v1(3),v2v3(3),vec1(3),vec2(3),vec3(3), vdiag(3), v3vdiag(3);
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
            vdiag[i] = (gradx(i,0)-gradx(i,1));
        }

        
        TPZNumeric::ProdVetorial(v1,v2,v1v2);
        TPZNumeric::ProdVetorial(v2,v3,v2v3);
        TPZNumeric::ProdVetorial(v3,v1,v3v1);
        TPZNumeric::ProdVetorial(v3,vdiag,v3vdiag);
        
        TVar Nv1v2 = TPZNumeric::Norm(v1v2);
        TVar Nv2v3 = TPZNumeric::Norm(v2v3);
        TVar Nv3v1 = TPZNumeric::Norm(v3v1);
        TVar Nv3vdiag = TPZNumeric::Norm(v3vdiag);
        
        /**
         * @file
         * @brief Computing mapped vector with scaling factor equal 1.0.
         * using contravariant piola mapping.
         */
        TPZManVector<TVar,3> NormalScales(4,1.);
        
        
        {
            Nv1v2 = 1.;
            Nv2v3 = 2.;
            Nv3v1 = 2.;
            Nv3vdiag = 2.;
        }
        
        
        for (int i=0; i<3; i++) {
            v1[i] /= detjac;
            v2[i] /= detjac;
            v3[i] /= detjac;
        }
        for (int i=0; i<3; i++)
        {
            for (int iv=0; iv<7; iv++)
            {
                directions(i,iv) = -v3[i]*NormalScales[0]*6.;
                directions(i,iv+34) = v3[i]*NormalScales[0]*6.;
            }
            //face 1
            directions(i,7) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,8) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,9) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,10) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,11) = ( directions(i,7)+directions(i,8) )/2.;
            directions(i,12) = (v1[i]-v2[i])*Nv3v1*NormalScales[2];
            directions(i,13) = ( directions(i,9)+directions(i,10) )/2.;
            directions(i,14) = -v2[i]*Nv3v1*NormalScales[2];
            directions(i,15) = ( directions(i,12)+directions(i,14) )/2.;
            //face 2
            directions(i,16) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,17) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,18) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,19) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,20) = (directions(i,16) + directions(i,17))/2.;
            directions(i,21) = v2[i]*Nv3vdiag*NormalScales[3];
            directions(i,22) = (directions(i,18) + directions(i,19))/2.;
            directions(i,23) = v1[i]*Nv3vdiag*NormalScales[3];
            directions(i,24) = (directions(i,21) + directions(i,23))/2.;
            //face 3
            directions(i,25) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,26) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,27) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,28) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,29) = ( directions(i,25)+directions(i,26) )/2.;
            directions(i,30) = (v2[i]-v1[i])*Nv2v3*NormalScales[1];
            directions(i,31) = ( directions(i,27)+directions(i,28) )/2.;
            directions(i,32) = -v1[i]*Nv2v3*NormalScales[1];
            directions(i,33) = ( directions(i,30)+directions(i,32) )/2.;
            
            //arestas
            directions(i,41) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,42) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,43) = -v2[i]*Nv3v1*NormalScales[2];//
            
            directions(i,44) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,45) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,46) = v3[i]*Nv1v2*NormalScales[0];
            
            directions(i,47) = v1[i]*Nv2v3*NormalScales[1];//
            directions(i,48) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,49) = -v2[i]*Nv3v1*NormalScales[2];//
            
            // internal in faces
            directions(i,50) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,51) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,52) = v1[i]*Nv2v3*NormalScales[1]/2.;//
            directions(i,53) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,54) = (v2[i]-v1[i])/2.;//*Nvdiag
            directions(i,55) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,56) = v2[i]*Nv3v1*NormalScales[2]/2.;
            directions(i,57) = v3[i]*Nv1v2*NormalScales[0];
            directions(i,58) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,59) = v2[i]*Nv3v1*NormalScales[2];
            
            
            directions(i,60) = v1[i]*Nv2v3*NormalScales[1];
            directions(i,61) = v2[i]*Nv3v1*NormalScales[2];
            directions(i,62) = v3[i]*Nv1v2*NormalScales[0];
            
        }
        
    }